

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O1

int Cudd_DumpFactoredForm(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  DdNode *pDVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (0 < n) {
    uVar4 = 0;
    do {
      if (onames == (char **)0x0) {
        iVar2 = fprintf((FILE *)fp,"f%d = ",uVar4 & 0xffffffff);
      }
      else {
        iVar2 = fprintf((FILE *)fp,"%s = ",onames[uVar4]);
      }
      if (iVar2 == -1) {
        return 0;
      }
      pDVar1 = f[uVar4];
      if (pDVar1 == dd->one) {
        pcVar3 = "CONST1";
LAB_007cea14:
        iVar2 = fprintf((FILE *)fp,pcVar3);
      }
      else {
        if ((pDVar1 == (DdNode *)((ulong)dd->one ^ 1)) || (pDVar1 == dd->zero)) {
          pcVar3 = "CONST0";
          goto LAB_007cea14;
        }
        pcVar3 = "!(";
        if (((ulong)pDVar1 & 1) == 0) {
          pcVar3 = "";
        }
        iVar2 = fprintf((FILE *)fp,"%s",pcVar3);
        if (iVar2 == -1) {
          return 0;
        }
        iVar2 = ddDoDumpFactoredForm(dd,(DdNode *)((ulong)f[uVar4] & 0xfffffffffffffffe),fp,inames);
        if (iVar2 == 0) {
          return 0;
        }
        pcVar3 = ")";
        if (((ulong)f[uVar4] & 1) == 0) {
          pcVar3 = "";
        }
        iVar2 = fprintf((FILE *)fp,"%s",pcVar3);
      }
      if (iVar2 == -1) {
        return 0;
      }
      pcVar3 = "\n";
      if (n - 1 == uVar4) {
        pcVar3 = "";
      }
      iVar2 = fprintf((FILE *)fp,"%s",pcVar3);
      if (iVar2 == -1) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return 1;
}

Assistant:

int
Cudd_DumpFactoredForm(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    int         retval;
    int         i;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) return(0);
        if (f[i] == DD_ONE(dd)) {
            retval = fprintf(fp, "CONST1");
            if (retval == EOF) return(0);
        } else if (f[i] == Cudd_Not(DD_ONE(dd)) || f[i] == DD_ZERO(dd)) {
            retval = fprintf(fp, "CONST0");
            if (retval == EOF) return(0);
        } else {
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? "!(" : "");
            if (retval == EOF) return(0);
            retval = ddDoDumpFactoredForm(dd,Cudd_Regular(f[i]),fp,inames);
            if (retval == 0) return(0);
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? ")" : "");
            if (retval == EOF) return(0);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : "\n");
        if (retval == EOF) return(0);
    }

    return(1);

}